

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O1

void __thiscall
jsoncons::csv::basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>::
basic_csv_cursor<std::__cxx11::string_const&>
          (basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          basic_csv_decode_options<char> *options,
          function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *alloc,type *param_5)

{
  string_view_type sv;
  _Any_data local_50;
  code *local_40;
  
  *(undefined8 *)this = 0xb5eba8;
  *(undefined8 *)(this + 0x288) = 0xb5ec48;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  this[0x20] = (basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>)0x1;
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)&local_50,
             err_handler);
  basic_csv_parser<char,_std::allocator<char>_>::basic_csv_parser
            ((basic_csv_parser<char,_std::allocator<char>_> *)(this + 0x28),options,
             (function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)&local_50,
             alloc);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  *(undefined ***)(this + 0x228) = &PTR__basic_json_visitor_00b59940;
  *(undefined2 *)(this + 0x230) = 3;
  *(undefined4 *)(this + 600) = 0;
  *(undefined8 *)(this + 0x238) = 0;
  *(undefined8 *)(this + 0x240) = 0;
  *(undefined8 *)(this + 0x244) = 0;
  *(undefined8 *)(this + 0x24c) = 0;
  *(undefined8 *)(this + 0x260) = 0;
  *(undefined8 *)(this + 0x268) = 0;
  *(undefined8 *)(this + 0x270) = 0;
  *(undefined8 *)(this + 0x278) = 0;
  *(undefined8 *)(this + 0x280) = 0;
  this[0x101] = (basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>)0x1;
  this[0x100] = (basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>)
                (this[0x7c] !=
                (basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>)0x3);
  sv._M_str = (source->_M_dataplus)._M_p;
  sv._M_len = source->_M_string_length;
  basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>::
  initialize_with_string_view
            ((basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *)this,sv
            );
  return;
}

Assistant:

basic_csv_cursor(Sourceable&& source, 
        const basic_csv_decode_options<CharT>& options = basic_csv_decode_options<CharT>(),
        std::function<bool(csv_errc,const ser_context&)> err_handler = default_csv_parsing(),
        const Allocator& alloc = Allocator(),
        typename std::enable_if<std::is_constructible<jsoncons::basic_string_view<CharT>,Sourceable>::value>::type* = 0)
       : source_(),
         parser_(options,err_handler,alloc)
    {
        parser_.cursor_mode(true);
        jsoncons::basic_string_view<CharT> sv(std::forward<Sourceable>(source));
        initialize_with_string_view(sv);
    }